

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  int iVar5;
  FileDescriptor *this_00;
  size_type sVar6;
  FieldDescriptor *pFVar7;
  OneofDescriptor *pOVar8;
  FieldDescriptor *pFVar9;
  Descriptor *pDVar10;
  long lVar11;
  string *in_RCX;
  SourceLocationCommentPrinter *in_RDX;
  int in_ESI;
  Descriptor *in_RDI;
  byte in_R8B;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::Descriptor_*>,_bool> pVar12;
  int i_8;
  ReservedRange *range;
  int i_7;
  int i_6;
  Descriptor *containing_type;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  SourceLocationCommentPrinter comment_printer;
  string prefix;
  SubstituteArg *in_stack_ffffffffffffe738;
  SubstituteArg *in_stack_ffffffffffffe740;
  SourceLocationCommentPrinter *pSVar13;
  SubstituteArg *in_stack_ffffffffffffe748;
  SubstituteArg *in_stack_ffffffffffffe750;
  SubstituteArg *in_stack_ffffffffffffe758;
  SubstituteArg *in_stack_ffffffffffffe760;
  string *in_stack_ffffffffffffe768;
  string *in_stack_ffffffffffffe770;
  SourceLocationCommentPrinter *in_stack_ffffffffffffe778;
  SourceLocationCommentPrinter *in_stack_ffffffffffffe780;
  string *in_stack_ffffffffffffe7a8;
  SourceLocationCommentPrinter *in_stack_ffffffffffffe7b0;
  SubstituteArg *in_stack_ffffffffffffe9b8;
  SubstituteArg *in_stack_ffffffffffffe9c0;
  SubstituteArg *in_stack_ffffffffffffe9c8;
  SubstituteArg *in_stack_ffffffffffffe9d0;
  string *in_stack_ffffffffffffe9d8;
  DescriptorPool *in_stack_ffffffffffffe9e0;
  Message *in_stack_ffffffffffffe9e8;
  undefined4 in_stack_ffffffffffffe9f0;
  int in_stack_ffffffffffffe9f4;
  SubstituteArg *in_stack_ffffffffffffe9f8;
  SubstituteArg *in_stack_ffffffffffffea00;
  SubstituteArg *in_stack_ffffffffffffea08;
  SubstituteArg *in_stack_ffffffffffffea10;
  SubstituteArg *in_stack_ffffffffffffea18;
  SubstituteArg local_15e0;
  undefined1 local_15b0 [96];
  SubstituteArg local_1550;
  SubstituteArg local_1520;
  SubstituteArg local_14f0 [2];
  SubstituteArg local_1490;
  SubstituteArg local_1460;
  SubstituteArg local_1430;
  SubstituteArg local_1400;
  SubstituteArg local_13d0;
  DebugStringOptions *in_stack_ffffffffffffec68;
  string *in_stack_ffffffffffffec70;
  int in_stack_ffffffffffffec7c;
  OneofDescriptor *in_stack_ffffffffffffec80;
  SubstituteArg local_1370;
  SubstituteArg local_1340;
  SubstituteArg local_1310;
  string local_12e0 [84];
  int local_128c;
  SubstituteArg local_1288;
  SubstituteArg local_1258;
  SubstituteArg local_1228;
  SubstituteArg local_11f8;
  SubstituteArg local_11c8;
  SubstituteArg local_1198;
  SubstituteArg local_1168;
  SubstituteArg local_1138;
  SubstituteArg local_1108 [2];
  SubstituteArg local_10a8;
  SubstituteArg local_1078;
  DebugStringOptions *in_stack_ffffffffffffefd8;
  string *in_stack_ffffffffffffefe0;
  PrintLabelFlag in_stack_ffffffffffffefe8;
  int in_stack_ffffffffffffefec;
  FieldDescriptor *in_stack_ffffffffffffeff0;
  SubstituteArg local_fe8;
  SubstituteArg local_fb8;
  SubstituteArg local_f88;
  SubstituteArg local_f58 [3];
  SubstituteArg local_ec8;
  SubstituteArg local_e98;
  SubstituteArg local_e68;
  SubstituteArg local_e38;
  SubstituteArg local_e08;
  SubstituteArg local_dd8;
  SubstituteArg local_da8;
  SubstituteArg local_d78;
  SubstituteArg local_d48 [2];
  ReservedRange *local_ce8;
  int local_cdc;
  SubstituteArg local_cd8;
  SubstituteArg local_ca8;
  SubstituteArg local_c78;
  SubstituteArg local_c48;
  SubstituteArg local_c18;
  SubstituteArg local_be8;
  SubstituteArg local_bb8;
  SubstituteArg local_b88;
  SubstituteArg local_b58 [2];
  SubstituteArg local_af8;
  SubstituteArg local_ac8;
  SubstituteArg local_a98;
  SubstituteArg local_a68;
  SubstituteArg local_a38;
  SubstituteArg local_a08;
  SubstituteArg local_9d8;
  DebugStringOptions *in_stack_fffffffffffff658;
  string *in_stack_fffffffffffff660;
  int in_stack_fffffffffffff66c;
  EnumDescriptor *in_stack_fffffffffffff670;
  SubstituteArg local_978 [2];
  SubstituteArg local_918;
  SubstituteArg local_8e8;
  SubstituteArg local_8b8;
  SubstituteArg local_888;
  SubstituteArg local_858;
  SubstituteArg local_828;
  SubstituteArg local_7f8;
  SubstituteArg local_7c8 [3];
  SubstituteArg local_738;
  SubstituteArg local_708;
  SubstituteArg local_6d8;
  SubstituteArg local_6a8;
  SubstituteArg local_678;
  SubstituteArg local_648;
  SubstituteArg local_618;
  SubstituteArg local_5e8;
  SubstituteArg local_5b8 [2];
  int local_554;
  Descriptor *local_550;
  SubstituteArg local_548;
  SubstituteArg local_518;
  SubstituteArg local_4e8;
  SubstituteArg local_4b8;
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428 [4];
  int local_364;
  int local_360;
  int local_35c;
  Descriptor *local_358;
  int local_34c;
  _Base_ptr local_348;
  undefined1 local_340;
  Descriptor *local_338;
  int local_32c;
  _Base_ptr local_328;
  undefined1 local_320;
  Descriptor *local_318;
  int local_30c;
  SubstituteArg local_2d8;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188 [6];
  allocator local_49;
  string local_48 [31];
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = in_R8B & 1;
  options(in_RDI);
  bVar2 = MessageOptions::map_entry((MessageOptions *)0x4b45af);
  if (!bVar2) {
    iVar5 = in_ESI * 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,(long)iVar5,' ',&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    in_ESI = in_ESI + 1;
    anon_unknown_1::SourceLocationCommentPrinter::
    SourceLocationCommentPrinter<google::protobuf::Descriptor>
              (in_stack_ffffffffffffe780,(Descriptor *)in_stack_ffffffffffffe778,
               in_stack_ffffffffffffe770,(DebugStringOptions *)in_stack_ffffffffffffe768);
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              (in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8);
    if ((bVar1 & 1) != 0) {
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
      name_abi_cxx11_(in_RDI);
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
      strings::internal::SubstituteArg::SubstituteArg(local_188);
      strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_218);
      strings::internal::SubstituteArg::SubstituteArg(&local_248);
      strings::internal::SubstituteArg::SubstituteArg(&local_278);
      strings::internal::SubstituteArg::SubstituteArg(&local_2a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_2d8);
      in_stack_ffffffffffffe760 = &local_2d8;
      in_stack_ffffffffffffe758 = &local_2a8;
      in_stack_ffffffffffffe750 = &local_278;
      in_stack_ffffffffffffe748 = &local_248;
      in_stack_ffffffffffffe740 = &local_218;
      in_stack_ffffffffffffe738 = &local_1e8;
      strings::SubstituteAndAppend
                ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                 in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,
                 (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                 in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                 in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
    }
    std::__cxx11::string::append(&in_RDX->have_source_loc_);
    options(in_RDI);
    this_00 = file(in_RDI);
    FileDescriptor::pool(this_00);
    anon_unknown_1::FormatLineOptions
              (in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,
               in_stack_ffffffffffffe9d8);
    std::
    set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           *)0x4b48b2);
    for (local_30c = 0; iVar5 = local_30c, iVar3 = field_count(in_RDI), iVar5 < iVar3;
        local_30c = local_30c + 1) {
      field(in_RDI,local_30c);
      TVar4 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffe750);
      if (TVar4 == TYPE_GROUP) {
        field(in_RDI,local_30c);
        local_318 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffe740);
        pVar12 = std::
                 set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)in_stack_ffffffffffffe760,(value_type *)in_stack_ffffffffffffe758);
        local_328 = (_Base_ptr)pVar12.first._M_node;
        local_320 = pVar12.second;
      }
    }
    for (local_32c = 0; iVar5 = local_32c, iVar3 = extension_count(in_RDI), iVar5 < iVar3;
        local_32c = local_32c + 1) {
      extension(in_RDI,local_32c);
      TVar4 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffe750);
      if (TVar4 == TYPE_GROUP) {
        extension(in_RDI,local_32c);
        local_338 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffe740);
        pVar12 = std::
                 set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)in_stack_ffffffffffffe760,(value_type *)in_stack_ffffffffffffe758);
        local_348 = (_Base_ptr)pVar12.first._M_node;
        local_340 = pVar12.second;
      }
    }
    for (local_34c = 0; iVar5 = local_34c, iVar3 = nested_type_count(in_RDI), iVar5 < iVar3;
        local_34c = local_34c + 1) {
      local_358 = nested_type(in_RDI,local_34c);
      sVar6 = std::
              set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::count((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)in_stack_ffffffffffffe750,(key_type *)in_stack_ffffffffffffe748);
      if (sVar6 == 0) {
        nested_type(in_RDI,local_34c);
        DebugString((Descriptor *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                    (int)((ulong)in_RDX >> 0x20),in_RCX,
                    (DebugStringOptions *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                    (bool)in_stack_ffffffffffffffd7);
      }
    }
    for (local_35c = 0; iVar5 = local_35c, iVar3 = enum_type_count(in_RDI), iVar5 < iVar3;
        local_35c = local_35c + 1) {
      enum_type(in_RDI,local_35c);
      EnumDescriptor::DebugString
                (in_stack_fffffffffffff670,in_stack_fffffffffffff66c,in_stack_fffffffffffff660,
                 in_stack_fffffffffffff658);
    }
    for (local_360 = 0; iVar5 = local_360, iVar3 = field_count(in_RDI), iVar5 < iVar3;
        local_360 = local_360 + 1) {
      pFVar7 = field(in_RDI,local_360);
      pOVar8 = FieldDescriptor::containing_oneof(pFVar7);
      if (pOVar8 == (OneofDescriptor *)0x0) {
        field(in_RDI,local_360);
        FieldDescriptor::DebugString
                  (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8,
                   in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      }
      else {
        pFVar7 = field(in_RDI,local_360);
        pOVar8 = FieldDescriptor::containing_oneof(pFVar7);
        pFVar7 = OneofDescriptor::field(pOVar8,0);
        pFVar9 = field(in_RDI,local_360);
        if (pFVar7 == pFVar9) {
          pFVar7 = field(in_RDI,local_360);
          FieldDescriptor::containing_oneof(pFVar7);
          OneofDescriptor::DebugString
                    (in_stack_ffffffffffffec80,in_stack_ffffffffffffec7c,in_stack_ffffffffffffec70,
                     in_stack_ffffffffffffec68);
        }
      }
    }
    for (local_364 = 0; iVar5 = local_364, iVar3 = extension_range_count(in_RDI), iVar5 < iVar3;
        local_364 = local_364 + 1) {
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
      iVar5 = (int)((ulong)in_stack_ffffffffffffe738 >> 0x20);
      extension_range(in_RDI,local_364);
      strings::internal::SubstituteArg::SubstituteArg(in_stack_ffffffffffffe740,iVar5);
      extension_range(in_RDI,local_364);
      strings::internal::SubstituteArg::SubstituteArg(in_stack_ffffffffffffe740,iVar5);
      strings::internal::SubstituteArg::SubstituteArg(local_428);
      strings::internal::SubstituteArg::SubstituteArg(&local_458);
      strings::internal::SubstituteArg::SubstituteArg(&local_488);
      strings::internal::SubstituteArg::SubstituteArg(&local_4b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_518);
      strings::internal::SubstituteArg::SubstituteArg(&local_548);
      in_stack_ffffffffffffe740 = &local_488;
      in_stack_ffffffffffffe738 = &local_458;
      strings::SubstituteAndAppend
                ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                 in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,
                 (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                 in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                 in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
    }
    local_550 = (Descriptor *)0x0;
    for (local_554 = 0; iVar5 = local_554, iVar3 = extension_count(in_RDI), iVar5 < iVar3;
        local_554 = local_554 + 1) {
      pFVar7 = extension(in_RDI,local_554);
      pDVar10 = FieldDescriptor::containing_type(pFVar7);
      if (pDVar10 != local_550) {
        if (0 < local_554) {
          strings::internal::SubstituteArg::SubstituteArg
                    (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
          strings::internal::SubstituteArg::SubstituteArg(local_5b8);
          strings::internal::SubstituteArg::SubstituteArg(&local_5e8);
          strings::internal::SubstituteArg::SubstituteArg(&local_618);
          strings::internal::SubstituteArg::SubstituteArg(&local_648);
          strings::internal::SubstituteArg::SubstituteArg(&local_678);
          strings::internal::SubstituteArg::SubstituteArg(&local_6a8);
          strings::internal::SubstituteArg::SubstituteArg(&local_6d8);
          strings::internal::SubstituteArg::SubstituteArg(&local_708);
          strings::internal::SubstituteArg::SubstituteArg(&local_738);
          in_stack_ffffffffffffe740 = &local_678;
          in_stack_ffffffffffffe738 = &local_648;
          strings::SubstituteAndAppend
                    ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                     in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                     in_stack_ffffffffffffe9b8,
                     (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                     in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                     in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
        }
        pFVar7 = extension(in_RDI,local_554);
        local_550 = FieldDescriptor::containing_type(pFVar7);
        strings::internal::SubstituteArg::SubstituteArg
                  (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
        full_name_abi_cxx11_(local_550);
        strings::internal::SubstituteArg::SubstituteArg
                  (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
        strings::internal::SubstituteArg::SubstituteArg(local_7c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_7f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_828);
        strings::internal::SubstituteArg::SubstituteArg(&local_858);
        strings::internal::SubstituteArg::SubstituteArg(&local_888);
        strings::internal::SubstituteArg::SubstituteArg(&local_8b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_8e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_918);
        in_stack_ffffffffffffe740 = &local_858;
        in_stack_ffffffffffffe738 = &local_828;
        strings::SubstituteAndAppend
                  ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                   in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                   in_stack_ffffffffffffe9b8,
                   (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                   in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                   in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
      }
      extension(in_RDI,local_554);
      FieldDescriptor::DebugString
                (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8,
                 in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    }
    iVar5 = extension_count(in_RDI);
    if (0 < iVar5) {
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
      strings::internal::SubstituteArg::SubstituteArg(local_978);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff658);
      strings::internal::SubstituteArg::SubstituteArg(&local_9d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_a08);
      strings::internal::SubstituteArg::SubstituteArg(&local_a38);
      strings::internal::SubstituteArg::SubstituteArg(&local_a68);
      strings::internal::SubstituteArg::SubstituteArg(&local_a98);
      strings::internal::SubstituteArg::SubstituteArg(&local_ac8);
      strings::internal::SubstituteArg::SubstituteArg(&local_af8);
      in_stack_ffffffffffffe740 = &local_a38;
      in_stack_ffffffffffffe738 = &local_a08;
      strings::SubstituteAndAppend
                ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                 in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,
                 (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                 in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                 in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
    }
    iVar5 = reserved_range_count(in_RDI);
    pSVar13 = in_RDX;
    if (0 < iVar5) {
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
      strings::internal::SubstituteArg::SubstituteArg(local_b58);
      strings::internal::SubstituteArg::SubstituteArg(&local_b88);
      strings::internal::SubstituteArg::SubstituteArg(&local_bb8);
      strings::internal::SubstituteArg::SubstituteArg(&local_be8);
      strings::internal::SubstituteArg::SubstituteArg(&local_c18);
      strings::internal::SubstituteArg::SubstituteArg(&local_c48);
      strings::internal::SubstituteArg::SubstituteArg(&local_c78);
      strings::internal::SubstituteArg::SubstituteArg(&local_ca8);
      strings::internal::SubstituteArg::SubstituteArg(&local_cd8);
      in_stack_ffffffffffffe740 = &local_c18;
      in_stack_ffffffffffffe738 = &local_be8;
      strings::SubstituteAndAppend
                ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                 in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,
                 (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                 in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                 in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
      for (local_cdc = 0; iVar5 = local_cdc, iVar3 = reserved_range_count(in_RDI), iVar5 < iVar3;
          local_cdc = local_cdc + 1) {
        local_ce8 = reserved_range(in_RDI,local_cdc);
        iVar5 = (int)((ulong)in_stack_ffffffffffffe738 >> 0x20);
        if (local_ce8->end == local_ce8->start + 1) {
          strings::internal::SubstituteArg::SubstituteArg(in_stack_ffffffffffffe740,iVar5);
          strings::internal::SubstituteArg::SubstituteArg(local_d48);
          strings::internal::SubstituteArg::SubstituteArg(&local_d78);
          strings::internal::SubstituteArg::SubstituteArg(&local_da8);
          strings::internal::SubstituteArg::SubstituteArg(&local_dd8);
          strings::internal::SubstituteArg::SubstituteArg(&local_e08);
          strings::internal::SubstituteArg::SubstituteArg(&local_e38);
          strings::internal::SubstituteArg::SubstituteArg(&local_e68);
          strings::internal::SubstituteArg::SubstituteArg(&local_e98);
          strings::internal::SubstituteArg::SubstituteArg(&local_ec8);
          in_stack_ffffffffffffe740 = &local_e08;
          in_stack_ffffffffffffe738 = &local_dd8;
          strings::SubstituteAndAppend
                    ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                     in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                     in_stack_ffffffffffffe9b8,
                     (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                     in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                     in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
        }
        else {
          strings::internal::SubstituteArg::SubstituteArg(in_stack_ffffffffffffe740,iVar5);
          strings::internal::SubstituteArg::SubstituteArg(in_stack_ffffffffffffe740,iVar5);
          strings::internal::SubstituteArg::SubstituteArg(local_f58);
          strings::internal::SubstituteArg::SubstituteArg(&local_f88);
          strings::internal::SubstituteArg::SubstituteArg(&local_fb8);
          strings::internal::SubstituteArg::SubstituteArg(&local_fe8);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xffffffffffffefe8)
          ;
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xffffffffffffefb8)
          ;
          strings::internal::SubstituteArg::SubstituteArg(&local_1078);
          strings::internal::SubstituteArg::SubstituteArg(&local_10a8);
          in_stack_ffffffffffffe740 = &local_fe8;
          in_stack_ffffffffffffe738 = &local_fb8;
          strings::SubstituteAndAppend
                    ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                     in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                     in_stack_ffffffffffffe9b8,
                     (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                     in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                     in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
        }
      }
      pSVar13 = in_RDX;
      lVar11 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)in_RDX,lVar11 - 2,(char *)0x2);
    }
    iVar5 = reserved_name_count(in_RDI);
    if (0 < iVar5) {
      strings::internal::SubstituteArg::SubstituteArg
                (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
      strings::internal::SubstituteArg::SubstituteArg(local_1108);
      strings::internal::SubstituteArg::SubstituteArg(&local_1138);
      strings::internal::SubstituteArg::SubstituteArg(&local_1168);
      strings::internal::SubstituteArg::SubstituteArg(&local_1198);
      strings::internal::SubstituteArg::SubstituteArg(&local_11c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_11f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1228);
      strings::internal::SubstituteArg::SubstituteArg(&local_1258);
      strings::internal::SubstituteArg::SubstituteArg(&local_1288);
      in_stack_ffffffffffffe740 = &local_11c8;
      in_stack_ffffffffffffe738 = &local_1198;
      strings::SubstituteAndAppend
                ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                 in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                 in_stack_ffffffffffffe9b8,
                 (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                 in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                 in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
      in_stack_ffffffffffffe778 = pSVar13;
      for (local_128c = 0; iVar5 = local_128c, iVar3 = reserved_name_count(in_RDI), iVar5 < iVar3;
          local_128c = local_128c + 1) {
        pSVar13 = in_stack_ffffffffffffe778;
        reserved_name_abi_cxx11_(in_RDI,local_128c);
        CEscape(in_stack_ffffffffffffe768);
        strings::internal::SubstituteArg::SubstituteArg
                  (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
        strings::internal::SubstituteArg::SubstituteArg(&local_1310);
        strings::internal::SubstituteArg::SubstituteArg(&local_1340);
        strings::internal::SubstituteArg::SubstituteArg(&local_1370);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xffffffffffffec60);
        strings::internal::SubstituteArg::SubstituteArg(&local_13d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_1400);
        strings::internal::SubstituteArg::SubstituteArg(&local_1430);
        strings::internal::SubstituteArg::SubstituteArg(&local_1460);
        strings::internal::SubstituteArg::SubstituteArg(&local_1490);
        in_stack_ffffffffffffe740 = &local_13d0;
        in_stack_ffffffffffffe738 = (SubstituteArg *)&stack0xffffffffffffec60;
        strings::SubstituteAndAppend
                  ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
                   in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                   in_stack_ffffffffffffe9b8,
                   (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                   in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
                   in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
        std::__cxx11::string::~string(local_12e0);
        in_stack_ffffffffffffe780 = in_stack_ffffffffffffe778;
        in_stack_ffffffffffffe778 = pSVar13;
      }
      lVar11 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)in_stack_ffffffffffffe778,lVar11 - 2,(char *)0x2);
    }
    strings::internal::SubstituteArg::SubstituteArg
              (in_stack_ffffffffffffe740,(string *)in_stack_ffffffffffffe738);
    strings::internal::SubstituteArg::SubstituteArg(local_14f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1520);
    strings::internal::SubstituteArg::SubstituteArg(&local_1550);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_15b0 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_15b0);
    strings::internal::SubstituteArg::SubstituteArg(&local_15e0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xffffffffffffe9f0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xffffffffffffe9c0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xffffffffffffe990);
    pSVar13 = (SourceLocationCommentPrinter *)local_15b0;
    strings::SubstituteAndAppend
              ((string *)in_stack_ffffffffffffe9e0,(char *)in_stack_ffffffffffffe9d8,
               in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
               in_stack_ffffffffffffe9b8,
               (SubstituteArg *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
               in_stack_ffffffffffffe9f8,in_stack_ffffffffffffea00,in_stack_ffffffffffffea08,
               in_stack_ffffffffffffea10,in_stack_ffffffffffffea18);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              (in_stack_ffffffffffffe780,(string *)in_stack_ffffffffffffe778);
    std::
    set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            *)0x4b5ecf);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(pSVar13);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    strings::SubstituteAndAppend(contents, "$0message $1", prefix, name());
  }
  contents->append(" {\n");

  FormatLineOptions(depth, options(), file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->containing_oneof() == nullptr) {
      field(i)->DebugString(depth, FieldDescriptor::PRINT_LABEL, contents,
                            debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n", prefix,
                                 extension_range(i)->start,
                                 extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                   containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, FieldDescriptor::PRINT_LABEL, contents,
                              debug_string_options);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                     range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                   CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}